

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall QL_Manager::SetUpFirstNode(QL_Manager *this,QL_Node **topNode)

{
  char **ppcVar1;
  int iVar2;
  int attrlistSize;
  RelCatEntry *pRVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Condition condition;
  Condition *pCVar6;
  int i;
  RC RVar7;
  QL_NodeRel *this_00;
  int *attrs;
  long lVar8;
  mapped_type *pmVar9;
  Condition *pCVar10;
  QL_NodeSel *this_01;
  bool bVar11;
  int local_6c;
  uint local_68;
  int index;
  int numConds;
  int local_5c;
  QL_NodeRel *local_58;
  string relString;
  
  this_00 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(this_00,this,this->relEntries);
  *topNode = (QL_Node *)this_00;
  pRVar3 = this->relEntries;
  attrs = (int *)malloc((long)pRVar3->attrCount << 2);
  attrs[0] = 0;
  attrs[1] = 0;
  for (lVar8 = 0; lVar8 < pRVar3->attrCount; lVar8 = lVar8 + 1) {
    attrs[lVar8] = 0;
  }
  std::__cxx11::string::string((string *)&relString,pRVar3->relName,(allocator *)&numConds);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->relToAttrIndex,&relString);
  iVar2 = *pmVar9;
  pRVar3 = this->relEntries;
  for (lVar8 = 0; attrlistSize = pRVar3->attrCount, lVar8 < attrlistSize; lVar8 = lVar8 + 1) {
    attrs[lVar8] = iVar2 + (int)lVar8;
  }
  QL_NodeRel::SetUpNode(this_00,attrs,attrlistSize);
  local_58 = this_00;
  free(attrs);
  CountNumConditions(this,0,&numConds);
  local_5c = numConds;
  local_68 = 0;
  bVar11 = false;
  for (local_6c = 0; local_6c < this->nConds; local_6c = local_6c + 1) {
    pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->conditionToRel,&local_6c);
    if (*pmVar9 == 0) {
      if ((((this->condptr[local_6c].op == EQ_OP) &&
           (pCVar10 = this->condptr + local_6c, pCVar10->bRhsIsAttr == 0)) && ((local_68 & 1) == 0))
         && (this->isUpdate == false)) {
        index = 0;
        RVar7 = GetAttrCatEntryPos(this,pCVar10->lhsAttr,&index);
        if (RVar7 != 0) goto LAB_0010cd29;
        if (this->attrEntries[index].indexNo != -1) {
          RVar7 = (*(local_58->super_QL_Node)._vptr_QL_Node[8])();
          if (RVar7 == 0) {
            local_68 = 1;
            goto LAB_0010cd1c;
          }
          goto LAB_0010cd29;
        }
      }
      if (bVar11) {
        this_01 = (QL_NodeSel *)*topNode;
      }
      else {
        this_01 = (QL_NodeSel *)operator_new(0x58);
        QL_NodeSel::QL_NodeSel(this_01,this,&local_58->super_QL_Node);
        RVar7 = QL_NodeSel::SetUpNode(this_01,local_5c);
        if (RVar7 != 0) goto LAB_0010cd29;
        *topNode = (QL_Node *)this_01;
      }
      pCVar10 = this->condptr;
      lVar8 = (long)local_6c;
      pCVar6 = pCVar10 + lVar8;
      uVar4 = pCVar6->op;
      uVar5 = pCVar6->bRhsIsAttr;
      condition.bRhsIsAttr = uVar5;
      condition.op = uVar4;
      ppcVar1 = &pCVar10[lVar8].rhsAttr.attrName;
      condition.lhsAttr = pCVar10[lVar8].lhsAttr;
      condition.rhsAttr.relName = ((RelAttr *)(&pCVar6->op + 2))->relName;
      condition.rhsAttr.attrName = *ppcVar1;
      condition.rhsValue._0_8_ = ppcVar1[1];
      condition.rhsValue.data = pCVar10[lVar8].rhsValue.data;
      RVar7 = QL_Node::AddCondition(&this_01->super_QL_Node,condition,local_6c);
      bVar11 = true;
      if (RVar7 != 0) goto LAB_0010cd29;
    }
LAB_0010cd1c:
  }
  RVar7 = 0;
LAB_0010cd29:
  std::__cxx11::string::~string((string *)&relString);
  return RVar7;
}

Assistant:

RC QL_Manager::SetUpFirstNode(QL_Node *&topNode){
  RC rc = 0;
  bool useSelNode = false; // whether a select node was used with this relation
  bool useIndex = false; // whether an index is being used on this relation
  int relIndex = 0; // take the first element of relEntries as the 1st relation

  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries);
  topNode = relNode;

  // Create the list of attributes associated with this relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString];
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node with this list of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // count the number of conditions associated with this node:
  int numConds;
  CountNumConditions(0, numConds);

  // For each of the conditions, add it to the relation
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == 0){
      bool added = false;
      // If it is a R.A=v condition, make the relation use index scan if there isn't already
      // an index, and if this isn't a update operation
      if(condptr[i].op == EQ_OP && !condptr[i].bRhsIsAttr && useIndex == false && isUpdate == false){
        int index = 0;
        if((rc = GetAttrCatEntryPos(condptr[i].lhsAttr, index) ))
          return (rc);
        if((attrEntries[index].indexNo != -1)){ // add only if there is an index on this attribute
          if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[i].rhsValue.data) ))
            return (rc);
          added = true;
          useIndex = true;
        }
      }
      // Otherwise, create a select node and add the condition to the select node (or just add
      // if select node has already been created)
      if(! added && !useSelNode){
        QL_NodeSel *selNode = new QL_NodeSel(*this, *relNode);
        if((rc = selNode->SetUpNode(numConds) ))
          return (rc);
        topNode = selNode;
        useSelNode = true;
      }
      if(! added){
        if((rc = topNode->AddCondition(condptr[i], i) ))
          return (rc);
      }
    }
  }
  return (0);
}